

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash_handler.c
# Opt level: O3

void linear_hash_dict_init(ion_dictionary_handler_t *handler)

{
  handler->insert = linear_hash_dict_insert;
  handler->get = linear_hash_dict_get;
  handler->create_dictionary = linear_hash_create_dictionary;
  handler->remove = linear_hash_dict_delete;
  handler->delete_dictionary = linear_hash_delete_dictionary;
  handler->destroy_dictionary = linear_hash_destroy_dictionary;
  handler->update = linear_hash_dict_update;
  handler->close_dictionary = linear_hash_close_dictionary;
  handler->open_dictionary = linear_hash_open_dictionary;
  return;
}

Assistant:

void
linear_hash_dict_init(
	ion_dictionary_handler_t *handler
) {
	handler->insert				= linear_hash_dict_insert;
	handler->get				= linear_hash_dict_get;
	handler->create_dictionary	= linear_hash_create_dictionary;
	handler->remove				= linear_hash_dict_delete;
	handler->delete_dictionary	= linear_hash_delete_dictionary;
	handler->destroy_dictionary = linear_hash_destroy_dictionary;
	handler->update				= linear_hash_dict_update;
	/* handler->find				= linear_hash_dict_find; */
	handler->close_dictionary	= linear_hash_close_dictionary;
	handler->open_dictionary	= linear_hash_open_dictionary;
}